

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

value_type __thiscall
andres::
BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
::operator()(BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<float,false,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<int,float,float>>
             *this,int it)

{
  reference x;
  reference y;
  float fVar1;
  int it_local;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<float,_false,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<int,_float,_float>_>
  *this_local;
  
  x = View<int,false,std::allocator<unsigned_long>>::operator()
                (*(View<int,false,std::allocator<unsigned_long>> **)this,it);
  y = View<float,false,std::allocator<unsigned_long>>::operator()
                (*(View<float,false,std::allocator<unsigned_long>> **)(this + 8),it);
  fVar1 = marray_detail::Plus<int,_float,_float>::operator()
                    ((Plus<int,_float,_float> *)(this + 0x10),x,y);
  return fVar1;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }